

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

void __thiscall amrex::BndryData::BndryData(BndryData *this,BndryData *src)

{
  EVP_PKEY_CTX *in_RSI;
  BndryData *in_RDI;
  BndryRegister *in_stack_00000008;
  BndryRegister *in_stack_00000010;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  Geometry *this_00;
  
  BndryRegister::BndryRegister(in_stack_00000010,in_stack_00000008);
  (in_RDI->super_BndryRegister)._vptr_BndryRegister = (_func_int **)&PTR__BndryData_01805c28;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::LayoutData(in_stack_ffffffffffffffc0);
  LayoutData<std::array<double,_6UL>_>::LayoutData
            ((LayoutData<std::array<double,_6UL>_> *)in_stack_ffffffffffffffc0);
  this_00 = (Geometry *)&in_RDI->masks;
  Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::Vector
            ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)0x16a4072);
  Geometry::Geometry(this_00);
  in_RDI->m_ncomp = *(int *)(in_RSI + 0xc70);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

BndryData::BndryData (const BndryData& src)
    :
    BndryRegister(src),
    m_ncomp(src.m_ncomp)
{
    init(src);
}